

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_node_create_vscalarf(fy_document *fyd,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  fy_node *pfVar6;
  char *__s;
  char *data;
  undefined8 uStack_50;
  undefined8 uStack_48;
  va_list _ap_orig;
  
  __s = (char *)&uStack_48;
  if (fmt == (char *)0x0 || fyd == (fy_document *)0x0) {
    pfVar6 = (fy_node *)0x0;
  }
  else {
    _ap_orig[0].overflow_arg_area = ap->reg_save_area;
    uStack_48._0_4_ = ap->gp_offset;
    uStack_48._4_4_ = ap->fp_offset;
    _ap_orig[0]._0_8_ = ap->overflow_arg_area;
    uStack_50 = 0x12365b;
    iVar2 = vsnprintf((char *)0x0,0,fmt,&uStack_48);
    data = (char *)0x0;
    if (iVar2 != -1) {
      lVar1 = -((long)iVar2 + 0x10U & 0xfffffffffffffff0);
      __s = (char *)((long)_ap_orig + lVar1 + -8);
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x123688;
      iVar3 = vsnprintf(__s,(long)iVar2 + 1,fmt,ap);
      if (iVar2 != iVar3) {
        *(code **)((long)&uStack_50 + lVar1) = fy_node_create_scalarf;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x1293,
                      "struct fy_node *fy_node_create_vscalarf(struct fy_document *, const char *, struct __va_list_tag *)"
                     );
      }
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x123695;
      sVar4 = strlen(__s);
      data = __s;
      if (0 < (long)sVar4) {
        pcVar5 = __s + sVar4;
        do {
          if (pcVar5[-1] != '\n') break;
          pcVar5 = pcVar5 + -1;
          *pcVar5 = '\0';
        } while (__s < pcVar5);
      }
    }
    __s[-8] = -0x3b;
    __s[-7] = '6';
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    pfVar6 = fy_node_create_scalar_internal(fyd,data,0xffffffffffffffff,4);
  }
  return pfVar6;
}

Assistant:

struct fy_node *fy_node_create_vscalarf(struct fy_document *fyd, const char *fmt, va_list ap) {
    if (!fyd || !fmt)
        return NULL;

    return fy_node_create_scalar_internal(fyd, alloca_vsprintf(fmt, ap), FY_NT, FYNCSIF_COPY);
}